

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O3

int IDASetQuadSensErrCon(void *ida_mem,int errconQS)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar1 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x435;
  }
  else if (*(int *)((long)ida_mem + 0x6b4) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar1 = -0x28;
    error_code = -0x28;
    line = 0x43d;
  }
  else {
    if (*(int *)((long)ida_mem + 0x6c0) != 0) {
      *(int *)((long)ida_mem + 300) = errconQS;
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar1 = -0x32;
    error_code = -0x32;
    line = 0x445;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetQuadSensErrCon",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int IDASetQuadSensErrCon(void* ida_mem, sunbooleantype errconQS)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Was sensitivity initialized? */
  if (IDA_mem->ida_sensMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  /* Was quadrature sensitivity initialized? */
  if (IDA_mem->ida_quadSensMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_QUADSENS);
  }

  IDA_mem->ida_errconQS = errconQS;

  return (IDA_SUCCESS);
}